

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Callback *cb)

{
  int iVar1;
  int local_24;
  int t;
  Fl_Callback *cb_local;
  Fl_Menu_ *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = size(this);
    if (iVar1 <= local_24) {
      return -1;
    }
    if (this->menu_[local_24].callback_ == cb) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int Fl_Menu_::find_index(Fl_Callback *cb) const {
  for ( int t=0; t < size(); t++ )
    if (menu_[t].callback_==cb)
      return(t);
  return(-1);
}